

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void parse_version(string *full_version_string,string *version,int *extension_level)

{
  int iVar1;
  pointer __s;
  char *pcVar2;
  char *local_58;
  char *p2;
  char *p1;
  char *v;
  unique_ptr<char[],_std::default_delete<char[]>_> vp;
  int *extension_level_local;
  string *version_local;
  string *full_version_string_local;
  
  vp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)extension_level;
  QUtil::make_unique_cstr((QUtil *)&v,full_version_string);
  __s = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)&v);
  pcVar2 = strchr(__s,0x2e);
  if (pcVar2 == (char *)0x0) {
    local_58 = (char *)0x0;
  }
  else {
    local_58 = strchr(pcVar2 + 1,0x2e);
  }
  if ((local_58 != (char *)0x0) && (local_58[1] != '\0')) {
    *local_58 = '\0';
    iVar1 = QUtil::string_to_int(local_58 + 1);
    *(int *)vp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl = iVar1;
  }
  std::__cxx11::string::operator=((string *)version,__s);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&v);
  return;
}

Assistant:

static void
parse_version(std::string const& full_version_string, std::string& version, int& extension_level)
{
    auto vp = QUtil::make_unique_cstr(full_version_string);
    char* v = vp.get();
    char* p1 = strchr(v, '.');
    char* p2 = (p1 ? strchr(1 + p1, '.') : nullptr);
    if (p2 && *(p2 + 1)) {
        *p2++ = '\0';
        extension_level = QUtil::string_to_int(p2);
    }
    version = v;
}